

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

void xreq0_send_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *m;
  xreq0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x1d8));
  if (nVar1 == NNG_OK) {
    nni_msgq_aio_get((nni_msgq *)**(undefined8 **)((long)arg + 8),(nni_aio *)((long)arg + 0x10));
  }
  else {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x1d8));
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x1d8),(nni_msg *)0x0);
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
xreq0_send_cb(void *arg)
{
	xreq0_pipe *p = arg;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	// Sent a message so we just need to look for another one.
	nni_msgq_aio_get(p->req->uwq, &p->aio_getq);
}